

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glad.c
# Opt level: O2

void load_GL_NV_shading_rate_image(GLADloadproc load)

{
  if (GLAD_GL_NV_shading_rate_image != 0) {
    glad_glBindShadingRateImageNV =
         (PFNGLBINDSHADINGRATEIMAGENVPROC)(*load)("glBindShadingRateImageNV");
    glad_glGetShadingRateImagePaletteNV =
         (PFNGLGETSHADINGRATEIMAGEPALETTENVPROC)(*load)("glGetShadingRateImagePaletteNV");
    glad_glGetShadingRateSampleLocationivNV =
         (PFNGLGETSHADINGRATESAMPLELOCATIONIVNVPROC)(*load)("glGetShadingRateSampleLocationivNV");
    glad_glShadingRateImageBarrierNV =
         (PFNGLSHADINGRATEIMAGEBARRIERNVPROC)(*load)("glShadingRateImageBarrierNV");
    glad_glShadingRateImagePaletteNV =
         (PFNGLSHADINGRATEIMAGEPALETTENVPROC)(*load)("glShadingRateImagePaletteNV");
    glad_glShadingRateSampleOrderNV =
         (PFNGLSHADINGRATESAMPLEORDERNVPROC)(*load)("glShadingRateSampleOrderNV");
    glad_glShadingRateSampleOrderCustomNV =
         (PFNGLSHADINGRATESAMPLEORDERCUSTOMNVPROC)(*load)("glShadingRateSampleOrderCustomNV");
  }
  return;
}

Assistant:

static void load_GL_NV_shading_rate_image(GLADloadproc load) {
	if(!GLAD_GL_NV_shading_rate_image) return;
	glad_glBindShadingRateImageNV = (PFNGLBINDSHADINGRATEIMAGENVPROC)load("glBindShadingRateImageNV");
	glad_glGetShadingRateImagePaletteNV = (PFNGLGETSHADINGRATEIMAGEPALETTENVPROC)load("glGetShadingRateImagePaletteNV");
	glad_glGetShadingRateSampleLocationivNV = (PFNGLGETSHADINGRATESAMPLELOCATIONIVNVPROC)load("glGetShadingRateSampleLocationivNV");
	glad_glShadingRateImageBarrierNV = (PFNGLSHADINGRATEIMAGEBARRIERNVPROC)load("glShadingRateImageBarrierNV");
	glad_glShadingRateImagePaletteNV = (PFNGLSHADINGRATEIMAGEPALETTENVPROC)load("glShadingRateImagePaletteNV");
	glad_glShadingRateSampleOrderNV = (PFNGLSHADINGRATESAMPLEORDERNVPROC)load("glShadingRateSampleOrderNV");
	glad_glShadingRateSampleOrderCustomNV = (PFNGLSHADINGRATESAMPLEORDERCUSTOMNVPROC)load("glShadingRateSampleOrderCustomNV");
}